

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_hashtable.cpp
# Opt level: O2

void __thiscall duckdb::JoinHashTable::Reset(JoinHashTable *this)

{
  pointer this_00;
  
  this_00 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
            ::operator->(&this->data_collection);
  TupleDataCollection::Reset(this_00);
  AllocatedData::Reset(&this->hash_map);
  TemplatedValidityMask<unsigned_long>::SetAllInvalid
            (&(this->current_partitions).super_TemplatedValidityMask<unsigned_long>,
             1L << ((byte)this->radix_bits & 0x3f));
  this->finalized = false;
  return;
}

Assistant:

void JoinHashTable::Reset() {
	data_collection->Reset();
	hash_map.Reset();
	current_partitions.SetAllInvalid(RadixPartitioning::NumberOfPartitions(radix_bits));
	finalized = false;
}